

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skeleton.cpp
# Opt level: O0

void __thiscall
CS248::DynamicScene::Skeleton::drawJoint(Skeleton *this,Joint *joint,int *pickID,bool pickMode)

{
  byte bVar1;
  bool bVar2;
  byte in_CL;
  Joint *in_RDX;
  Skeleton *in_RSI;
  Skeleton *in_RDI;
  Joint *child;
  iterator __end2;
  iterator __begin2;
  vector<CS248::DynamicScene::Joint_*,_std::allocator<CS248::DynamicScene::Joint_*>_> *__range2;
  GLfloat white [4];
  DrawStyle *style;
  GLUquadric *q;
  double jointRenderScale;
  Vector3D jointAxis;
  Vector3D jointScale;
  Vector3D jointRot;
  Vector3D jointPos;
  vector<CS248::DynamicScene::Joint_*,_std::allocator<CS248::DynamicScene::Joint_*>_>
  *in_stack_ffffffffffffff28;
  Joint *in_stack_ffffffffffffff40;
  __normal_iterator<CS248::DynamicScene::Joint_**,_std::vector<CS248::DynamicScene::Joint_*,_std::allocator<CS248::DynamicScene::Joint_*>_>_>
  in_stack_ffffffffffffff48;
  Skeleton *in_stack_ffffffffffffff50;
  undefined8 local_a8;
  undefined8 local_a0;
  DrawStyle *local_98;
  undefined8 local_90;
  double local_88;
  Vector3D local_80;
  Vector3D local_68;
  Vector3D local_50;
  double local_38;
  double local_30;
  undefined7 local_28;
  undefined1 in_stack_ffffffffffffffdf;
  undefined7 in_stack_ffffffffffffffe0;
  
  bVar1 = in_CL & 1;
  Vector3D::Vector3D((Vector3D *)&local_38,&(in_RSI->super_SceneObject).position);
  Vector3D::Vector3D(&local_50,&(in_RSI->super_SceneObject).rotation);
  Vector3D::Vector3D(&local_68,&(in_RSI->super_SceneObject).scale);
  Vector3D::Vector3D(&local_80,
                     (Vector3D *)
                     &(in_RSI->joints).
                      super__Vector_base<CS248::DynamicScene::Joint_*,_std::allocator<CS248::DynamicScene::Joint_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish);
  local_88 = (in_RSI->currentTransformation).entries[2].x;
  local_90 = gluNewQuadric();
  glPushMatrix();
  glTranslated(local_38,local_30,CONCAT17(in_stack_ffffffffffffffdf,local_28));
  glRotatef((float)local_50.x,0x3f800000,0);
  glRotatef((float)local_50.y,0,0x3f800000);
  glRotatef((float)local_50.z,0,0,0x3f800000);
  glScalef((float)local_68.x,(float)local_68.y,(float)local_68.z);
  local_98 = get_draw_style(in_RDI,(Joint *)in_RSI);
  if ((bVar1 & 1) == 0) {
    if (local_98 == in_RDI->defaultStyle) {
      local_a8 = 0x3f8000003f800000;
      local_a0 = 0x3f8000003f800000;
      glEnable(0xb50);
      glEnable(0x4000);
      glLightfv(0x4000,0x1201,&local_a8);
      glMaterialfv(0x408,0x1201,&local_a8);
      glEnable(0xbe2);
      glBlendFunc(1);
    }
    else {
      glDisable(0xb50);
      DrawStyle::style_joint((DrawStyle *)in_RDI);
    }
  }
  else {
    newPickElement(in_stack_ffffffffffffff50,(int *)in_stack_ffffffffffffff48._M_current,
                   in_stack_ffffffffffffff40);
  }
  glBegin(1);
  glVertex3d(0,0);
  glVertex3d(local_80.x,local_80.y,local_80.z);
  glEnd();
  glTranslated(local_80.x,local_80.y,local_80.z);
  gluSphere(local_88 * 0.03,local_90,0x19);
  if (((bVar1 & 1) == 0) && (local_98 != in_RDI->defaultStyle)) {
    glEnable(0xb50);
    DrawStyle::style_reset((DrawStyle *)0x211d33);
  }
  else {
    glDisable(0xbe2);
  }
  std::vector<CS248::DynamicScene::Joint_*,_std::allocator<CS248::DynamicScene::Joint_*>_>::begin
            (in_stack_ffffffffffffff28);
  std::vector<CS248::DynamicScene::Joint_*,_std::allocator<CS248::DynamicScene::Joint_*>_>::end
            (in_stack_ffffffffffffff28);
  while (bVar2 = __gnu_cxx::operator!=
                           ((__normal_iterator<CS248::DynamicScene::Joint_**,_std::vector<CS248::DynamicScene::Joint_*,_std::allocator<CS248::DynamicScene::Joint_*>_>_>
                             *)in_RDI,
                            (__normal_iterator<CS248::DynamicScene::Joint_**,_std::vector<CS248::DynamicScene::Joint_*,_std::allocator<CS248::DynamicScene::Joint_*>_>_>
                             *)in_stack_ffffffffffffff28), bVar2) {
    __gnu_cxx::
    __normal_iterator<CS248::DynamicScene::Joint_**,_std::vector<CS248::DynamicScene::Joint_*,_std::allocator<CS248::DynamicScene::Joint_*>_>_>
    ::operator*((__normal_iterator<CS248::DynamicScene::Joint_**,_std::vector<CS248::DynamicScene::Joint_*,_std::allocator<CS248::DynamicScene::Joint_*>_>_>
                 *)&stack0xffffffffffffff48);
    drawJoint(in_RSI,in_RDX,(int *)CONCAT17(bVar1,in_stack_ffffffffffffffe0),
              (bool)in_stack_ffffffffffffffdf);
    __gnu_cxx::
    __normal_iterator<CS248::DynamicScene::Joint_**,_std::vector<CS248::DynamicScene::Joint_*,_std::allocator<CS248::DynamicScene::Joint_*>_>_>
    ::operator++((__normal_iterator<CS248::DynamicScene::Joint_**,_std::vector<CS248::DynamicScene::Joint_*,_std::allocator<CS248::DynamicScene::Joint_*>_>_>
                  *)&stack0xffffffffffffff48);
  }
  glPopMatrix();
  gluDeleteQuadric(local_90);
  return;
}

Assistant:

void Skeleton::drawJoint(Joint* joint, int& pickID, bool pickMode) {
  Vector3D jointPos = joint->position;
  Vector3D jointRot = joint->rotation;
  Vector3D jointScale = joint->scale;
  Vector3D jointAxis = joint->axis;
  double jointRenderScale = joint->renderScale;
  GLUquadric* q = gluNewQuadric();

  glPushMatrix();

  glTranslated(jointPos.x, jointPos.y, jointPos.z);
  glRotatef(jointRot.x, 1.0f, 0.0f, 0.0f);
  glRotatef(jointRot.y, 0.0f, 1.0f, 0.0f);
  glRotatef(jointRot.z, 0.0f, 0.0f, 1.0f);
  glScalef(jointScale.x, jointScale.y, jointScale.z);

  DrawStyle* style = get_draw_style(joint);
  if (pickMode) {
    newPickElement(pickID, joint);
  } else if (style != defaultStyle) {
    glDisable(GL_LIGHTING);
    style->style_joint();
  } else {
    GLfloat white[4] = {1., 1., 1., 1.};

    glEnable(GL_LIGHTING);
    glEnable(GL_LIGHT0);
    glLightfv(GL_LIGHT0, GL_DIFFUSE, white);
    glMaterialfv(GL_FRONT_AND_BACK, GL_DIFFUSE, white);

    glEnable(GL_BLEND);
    // glBlendFunc(GL_SRC_ALPHA, GL_ONE_MINUS_SRC_ALPHA);
    glBlendFunc(GL_ONE, GL_ONE);
  }

  glBegin(GL_LINES);
  glVertex3d(0, 0, 0);
  glVertex3d(jointAxis.x, jointAxis.y, jointAxis.z);
  glEnd();
  glTranslated(jointAxis.x, jointAxis.y, jointAxis.z);
  gluSphere(q, jointRenderScale * 0.03, 25, 25);

  if (!pickMode && style != defaultStyle) {
    glEnable(GL_LIGHTING);
    style->style_reset();
  } else {
    glDisable(GL_BLEND);
  }

  for (Joint* child : joint->kids) drawJoint(child, pickID, pickMode);

  glPopMatrix();
  gluDeleteQuadric(q);
}